

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O3

void test_linear_hash_correct_bucket_after_split(planck_unit_test_t *tc)

{
  ion_byte_t *piVar1;
  array_list_t *paVar2;
  long lVar3;
  planck_unit_result_t pVar4;
  int iVar5;
  linear_hash_table_t *linear_hash;
  ion_fpos_t iVar6;
  ulong uVar7;
  ion_fpos_t iVar8;
  int iVar9;
  ion_byte_t *key;
  undefined8 auStack_60 [3];
  ion_byte_t local_48 [4];
  undefined4 local_44;
  ion_byte_t *local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  auStack_60[2] = 0x101dbf;
  linear_hash = (linear_hash_table_t *)malloc(0x78);
  auStack_60[2] = 0x101de0;
  test_linear_hash_create(tc,linear_hash,key_type_numeric_signed,4,4,4);
  iVar9 = (linear_hash->num_buckets + 1) * linear_hash->records_per_bucket *
          linear_hash->split_threshold;
  auStack_60[2] = 0x101dfc;
  iVar6 = array_list_get(0,linear_hash->bucket_map);
  uVar7 = (long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0;
  lVar3 = -uVar7;
  key = local_48 + lVar3;
  piVar1 = local_48 + -uVar7;
  piVar1[0] = '\x02';
  piVar1[1] = '\0';
  piVar1[2] = '\0';
  piVar1[3] = '\0';
  *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101e2c;
  iVar5 = insert_hash_to_bucket(key,linear_hash);
  if (iVar5 < linear_hash->next_split) {
    *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101e3d;
    iVar5 = hash_to_bucket(key,linear_hash);
  }
  paVar2 = linear_hash->bucket_map;
  local_40 = key;
  *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101e4f;
  iVar8 = array_list_get(iVar5,paVar2);
  *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101e76;
  pVar4 = planck_unit_assert_true
                    (tc,(uint)(iVar6 == iVar8),0x182,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar4 != '\0') {
    if (99 < iVar9) {
      iVar5 = 0;
      do {
        local_38 = 2;
        local_34 = 5;
        *(linear_hash_table_t **)((long)auStack_60 + lVar3 + 8) = linear_hash;
        *(undefined8 *)((long)auStack_60 + lVar3) = 0x101ed6;
        test_linear_hash_insert
                  (tc,&local_38,&local_34,'\0',1,'\x01',
                   *(linear_hash_table_t **)((long)auStack_60 + lVar3 + 8));
        iVar5 = iVar5 + 1;
      } while (iVar5 < iVar9 / 100);
    }
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_44 = 5;
    *(linear_hash_table_t **)((long)auStack_60 + lVar3 + 8) = linear_hash;
    *(undefined8 *)((long)auStack_60 + lVar3) = 0x101f11;
    test_linear_hash_insert
              (tc,local_48,&local_44,'\0',1,'\x01',
               *(linear_hash_table_t **)((long)auStack_60 + lVar3 + 8));
    paVar2 = linear_hash->bucket_map;
    *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101f21;
    iVar6 = array_list_get(0,paVar2);
    piVar1 = local_40;
    *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101f33;
    iVar5 = insert_hash_to_bucket(piVar1,linear_hash);
    if (iVar5 < linear_hash->next_split) {
      *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101f45;
      iVar5 = hash_to_bucket(piVar1,linear_hash);
    }
    paVar2 = linear_hash->bucket_map;
    *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101f51;
    iVar8 = array_list_get(iVar5,paVar2);
    *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101f75;
    pVar4 = planck_unit_assert_true
                      (tc,(uint)(iVar6 == iVar8),0x199,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                       ,"condition was false, expected true");
    if (pVar4 != '\0') {
      *(undefined8 *)((long)auStack_60 + lVar3 + 0x10) = 0x101f84;
      test_linear_hash_destroy(tc,linear_hash);
      return;
    }
  }
  *(code **)((long)auStack_60 + lVar3 + 0x10) = test_linear_hash_global_record_increments_decrements
  ;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_correct_bucket_after_split(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	double split_cardinality				= linear_hash->records_per_bucket * (linear_hash->num_buckets + 1) * linear_hash->split_threshold / 100;

	/* assuming initial size of 5 so that key 5 hashes to bucket 0 using h0 */
	int			expected_hash_bucket		= 0;
	ion_fpos_t	expected_bucket_location	= array_list_get(expected_hash_bucket, linear_hash->bucket_map);

	int *k									= alloca(sizeof(int));

	*k = 2;

	ion_byte_t *hash_key = alloca(linear_hash->super.record.key_size);

	memcpy(hash_key, k, sizeof(linear_hash->super.record.key_size));

	/* resolve bucket key 5 hashes to given the current linear_hash state - should be 0 */
	int hash_idx = insert_hash_to_bucket(hash_key, linear_hash);

	if (hash_idx < linear_hash->next_split) {
		hash_idx = hash_to_bucket(hash_key, linear_hash);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_location == array_list_get(hash_idx, linear_hash->bucket_map));

	int i;

	/* test while inserting to reach threshold - linear_hash.num_buckets should not change over this range */
	for (i = 0; i < split_cardinality; i++) {
		test_linear_hash_insert(tc, IONIZE(2, int), IONIZE(5, int), err_ok, 1, boolean_true, linear_hash);
	}

	/* test inserting push above threshold - linear_hash.num_buckets should increase by one */
	test_linear_hash_insert(tc, IONIZE(2, int), IONIZE(5, int), err_ok, 1, boolean_true, linear_hash);

	expected_hash_bucket		= 0;
	expected_bucket_location	= array_list_get(expected_hash_bucket, linear_hash->bucket_map);

	/* resolve key 2 hashes to given the current linear_hash state - should be 2 */
	hash_idx					= insert_hash_to_bucket(hash_key, linear_hash);

	if (hash_idx < linear_hash->next_split) {
		hash_idx = hash_to_bucket(hash_key, linear_hash);
	}

	/* assuming initial size of 2 so that key 2 hashes to bucket 2 using h1 */
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_location == array_list_get(hash_idx, linear_hash->bucket_map));

	test_linear_hash_takedown(tc, linear_hash);
}